

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliffordLib.cpp
# Opt level: O0

void cDump(Clifford *Q)

{
  bool bVar1;
  reference pBVar2;
  pointer pBVar3;
  int local_24;
  iterator iStack_20;
  int j;
  __normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_> local_18;
  idx i;
  Clifford *Q_local;
  
  i._M_current = (Blade *)Q;
  local_18._M_current = (Blade *)std::vector<Blade,_std::allocator<Blade>_>::begin(Q);
  while( true ) {
    iStack_20 = std::vector<Blade,_std::allocator<Blade>_>::end(Q);
    bVar1 = __gnu_cxx::operator!=(&local_18,&stack0xffffffffffffffe0);
    if (!bVar1) break;
    pBVar2 = __gnu_cxx::__normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_>::
             operator*(&local_18);
    if (0.0 < pBVar2->mVal) {
      printf("+");
    }
    pBVar3 = __gnu_cxx::__normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_>::
             operator->(&local_18);
    printf("%f",(double)pBVar3->mVal);
    pBVar3 = __gnu_cxx::__normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_>::
             operator->(&local_18);
    if (pBVar3->mBase != 0) {
      printf("e");
      for (local_24 = 0; local_24 < tp + tq; local_24 = local_24 + 1) {
        pBVar3 = __gnu_cxx::__normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_>
                 ::operator->(&local_18);
        if ((pBVar3->mBase >> ((byte)local_24 & 0x1f) & 1U) != 0) {
          printf("%d");
        }
      }
    }
    __gnu_cxx::__normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_>::operator++
              (&local_18,0);
  }
  printf("\n");
  return;
}

Assistant:

void cDump(Clifford Q)
{
 idx i=Q.begin();
 while(i!=Q.end())
	    {
		//SIGNO DEL BLADE	
		if ((*i).mVal > 0)printf("+");

		//VALOR DEL BLADE	
		printf("%f",(i->mVal));
		//NOMBRE DEL BLADE
        if(i->mBase){printf("e");;
		for(register int j=0;j<(tp+tq);j++)
		{
			if(((i->mBase)>>j)&1)
			{
				printf("%d",(j+1));
			}
		}
		}
	    i++;
	    }
		
   printf("\n");
 return ;
}